

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void action_bribe(tgestate_t *state)

{
  uint8_t *puVar1;
  char cVar2;
  
  puVar1 = &state->vischars[1].flags;
  cVar2 = -7;
  do {
    if ((byte)(((vischar_t *)(puVar1 + -1))->character - 0x14) < 0xeb) {
      state->bribed_character = ((vischar_t *)(puVar1 + -1))->character;
      *puVar1 = '\x01';
      return;
    }
    puVar1 = puVar1 + 0x40;
    cVar2 = cVar2 + '\x01';
  } while (cVar2 != '\0');
  return;
}

Assistant:

void action_bribe(tgestate_t *state)
{
  vischar_t *vischar;   /* was HL */
  uint8_t    iters;     /* was B */
  uint8_t    character; /* was A */

  assert(state != NULL);

  /* Walk non-player visible characters. */
  vischar = &state->vischars[1];
  iters = vischars_LENGTH - 1;
  do
  {
    character = vischar->character;
    if (character != character_NONE && character >= character_20_PRISONER_1)
      goto found;
    vischar++;
  }
  while (--iters);

  return;

found:
  state->bribed_character = character;
  vischar->flags = vischar_PURSUIT_PURSUE; /* Bribed character pursues hero. */
}